

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_region.cpp
# Opt level: O1

void __thiscall
ON_BrepRegionTopology::ON_BrepRegionTopology(ON_BrepRegionTopology *this,ON_BrepRegionTopology *src)

{
  ON_BrepFaceSide *pOVar1;
  ON_BrepRegion *pOVar2;
  long lVar3;
  long lVar4;
  
  ON_BrepFaceSideArray::ON_BrepFaceSideArray(&this->m_FS);
  ON_BrepRegionArray::ON_BrepRegionArray(&this->m_R);
  this->m_brep = (ON_Brep *)0x0;
  if (this != src) {
    ON_ClassArray<ON_BrepFaceSide>::operator=
              ((ON_ClassArray<ON_BrepFaceSide> *)this,(ON_ClassArray<ON_BrepFaceSide> *)src);
    ON_ClassArray<ON_BrepRegion>::operator=
              ((ON_ClassArray<ON_BrepRegion> *)&this->m_R,(ON_ClassArray<ON_BrepRegion> *)&src->m_R)
    ;
  }
  lVar3 = (long)(this->m_FS).super_ON_ObjectArray<ON_BrepFaceSide>.
                super_ON_ClassArray<ON_BrepFaceSide>.m_count;
  if (0 < lVar3) {
    pOVar1 = (this->m_FS).super_ON_ObjectArray<ON_BrepFaceSide>.super_ON_ClassArray<ON_BrepFaceSide>
             .m_a;
    lVar4 = 0;
    do {
      *(ON_BrepRegionTopology **)((long)&pOVar1->m_rtop + lVar4) = this;
      lVar4 = lVar4 + 0x30;
    } while (lVar3 * 0x30 != lVar4);
  }
  lVar3 = (long)(this->m_R).super_ON_ObjectArray<ON_BrepRegion>.super_ON_ClassArray<ON_BrepRegion>.
                m_count;
  if (0 < lVar3) {
    pOVar2 = (this->m_R).super_ON_ObjectArray<ON_BrepRegion>.super_ON_ClassArray<ON_BrepRegion>.m_a;
    lVar4 = 0;
    do {
      *(ON_BrepRegionTopology **)((long)&pOVar2->m_rtop + lVar4) = this;
      lVar4 = lVar4 + 0x78;
    } while (lVar3 * 0x78 - lVar4 != 0);
  }
  return;
}

Assistant:

ON_BrepRegionTopology::ON_BrepRegionTopology(const ON_BrepRegionTopology& src)
{
  int i;
  // do not copy m_brep
  m_brep = 0;
  m_FS = src.m_FS;
  m_R = src.m_R;
  for (i = 0; i < m_FS.Count(); i++ )
    m_FS[i].m_rtop = this;
  for (i = 0; i < m_R.Count(); i++ )
    m_R[i].m_rtop = this;
}